

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O2

void __thiscall
CfgNode::BlockData::addInstructions
          (BlockData *this,list<Instruction_*,_std::allocator<Instruction_*>_> *instrs)

{
  list<Instruction_*,_std::allocator<Instruction_*>_> *__range1;
  _List_node_base *p_Var1;
  
  p_Var1 = (_List_node_base *)instrs;
  while (p_Var1 = (((_List_base<Instruction_*,_std::allocator<Instruction_*>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)instrs) {
    addInstruction(this,(Instruction *)p_Var1[1]._M_next);
  }
  return;
}

Assistant:

void CfgNode::BlockData::addInstructions(const std::list<Instruction*>& instrs) {
	for (Instruction* instr : instrs)
		this->addInstruction(instr);
}